

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>_>::
int_writer<unsigned_long_long,_fmt::v6::basic_format_specs<wchar_t>_>::on_num
          (int_writer<unsigned_long_long,_fmt::v6::basic_format_specs<wchar_t>_> *this)

{
  char *pcVar1;
  char cVar2;
  basic_format_specs<wchar_t> *pbVar3;
  long lVar4;
  int iVar5;
  wchar_t wVar6;
  uint uVar7;
  uint uVar8;
  _Alloc_hider _Var9;
  _Alloc_hider _Var10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  string groups;
  format_specs local_d8;
  string local_b8;
  ulong local_98;
  ulong uStack_90;
  wchar_t local_88 [6];
  padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>_>::int_writer<unsigned_long_long,_fmt::v6::basic_format_specs<wchar_t>_>::num_writer>
  local_70;
  
  grouping_impl<wchar_t>(&local_b8,(locale_ref)(this->writer->locale_).locale_);
  if (local_b8._M_string_length == 0) {
    on_dec(this);
  }
  else {
    wVar6 = thousands_sep_impl<wchar_t>((locale_ref)(this->writer->locale_).locale_);
    if (wVar6 == L'\0') {
      on_dec(this);
    }
    else {
      local_70.f.abs_value = this->abs_value;
      lVar4 = 0x3f;
      if ((local_70.f.abs_value | 1) != 0) {
        for (; (local_70.f.abs_value | 1) >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      uVar7 = ((uint)lVar4 ^ 0xffffffc0) * 0x4d1 + 0x13911 >> 0xc;
      uVar11 = uVar7 + (*(ulong *)(basic_data<void>::zero_or_powers_of_10_64 + (ulong)uVar7 * 8) <=
                       local_70.f.abs_value);
      pcVar1 = local_b8._M_dataplus._M_p + local_b8._M_string_length;
      _Var10._M_p = local_b8._M_dataplus._M_p;
      local_70.f.size = uVar11;
      uVar8 = uVar11;
      if (local_b8._M_string_length != 0) {
        iVar5 = (int)local_b8._M_string_length;
        _Var9._M_p = local_b8._M_dataplus._M_p;
        do {
          cVar2 = *_Var9._M_p;
          uVar13 = uVar8 - (int)cVar2;
          _Var10._M_p = _Var9._M_p;
          local_70.f.size = uVar11;
          if ((uVar13 == 0 || (int)uVar8 < (int)cVar2) || ((byte)(cVar2 + 0x81U) < 0x82)) break;
          uVar11 = uVar11 + 1;
          _Var9._M_p = _Var9._M_p + 1;
          local_b8._M_string_length = local_b8._M_string_length - 1;
          _Var10._M_p = pcVar1;
          local_70.f.size =
               iVar5 + uVar7 + (*(ulong *)(basic_data<void>::zero_or_powers_of_10_64 +
                                          (ulong)uVar7 * 8) <= local_70.f.abs_value);
          uVar8 = uVar13;
        } while (local_b8._M_string_length != 0);
      }
      if (_Var10._M_p == pcVar1) {
        local_70.f.size = local_70.f.size + (int)(uVar8 - 1) / (int)pcVar1[-1];
      }
      pbVar3 = this->specs;
      local_70.prefix.size_ = (size_t)this->prefix_size;
      local_d8.width = pbVar3->width;
      local_d8.precision = pbVar3->precision;
      uStack_90._0_1_ = pbVar3->type;
      uStack_90._1_3_ = *(undefined3 *)&pbVar3->field_0x9;
      uStack_90._4_4_ = (pbVar3->fill).data_[0];
      local_d8.fill.data_._4_8_ = *(undefined8 *)((pbVar3->fill).data_ + 1);
      local_d8.fill._12_8_ = *(undefined8 *)((pbVar3->fill).data_ + 3);
      uVar12 = (uint)local_70.f.size + local_70.prefix.size_;
      local_d8._9_1_ = SUB31(uStack_90._1_3_,0);
      local_70.size_ = uVar12;
      local_70.fill = uStack_90._4_4_;
      if ((local_d8._9_1_ & 0xf) == 4) {
        uVar14 = local_d8._0_8_ & 0xffffffff;
        local_70.padding = 0;
        if (uVar12 <= uVar14) {
          local_70.size_ = uVar14;
          local_70.padding = uVar14 - uVar12;
        }
      }
      else if (local_70.f.size < (int)local_d8.precision) {
        local_70.size_ = (uint)local_d8.precision + local_70.prefix.size_;
        local_70.padding = (ulong)(uint)(local_d8.precision - local_70.f.size);
        local_70.fill = L'0';
      }
      else {
        local_70.padding = 0;
      }
      local_70.prefix.data_ = this->prefix;
      local_d8._8_8_ = uStack_90;
      if ((uStack_90 & 0xf00) == 0) {
        local_d8._8_8_ = uStack_90 | 0x200;
      }
      local_98 = local_d8._0_8_;
      local_88._0_8_ = local_d8.fill.data_._4_8_;
      local_88._8_8_ = local_d8.fill._12_8_;
      local_70.f.groups = &local_b8;
      local_70.f.sep = wVar6;
      basic_writer<fmt::v6::buffer_range<wchar_t>>::
      write_padded<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<unsigned_long_long,fmt::v6::basic_format_specs<wchar_t>>::num_writer>>
                ((basic_writer<fmt::v6::buffer_range<wchar_t>> *)this->writer,&local_d8,&local_70);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  return;
}

Assistant:

void on_num() {
      std::string groups = grouping<char_type>(writer.locale_);
      if (groups.empty()) return on_dec();
      auto sep = thousands_sep<char_type>(writer.locale_);
      if (!sep) return on_dec();
      int num_digits = count_digits(abs_value);
      int size = num_digits;
      std::string::const_iterator group = groups.cbegin();
      while (group != groups.cend() && num_digits > *group && *group > 0 &&
             *group != max_value<char>()) {
        size += sep_size;
        num_digits -= *group;
        ++group;
      }
      if (group == groups.cend())
        size += sep_size * ((num_digits - 1) / groups.back());
      writer.write_int(size, get_prefix(), specs,
                       num_writer{abs_value, size, groups, sep});
    }